

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O2

ErrorGenerator *
JsonErrors::INVALID_OBJECT
          (ErrorGenerator *__return_storage_ptr__,ObjectError errorType,Members *extraFields)

{
  ObjectErrorGenerator OStack_58;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.cxx:94:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmJSONHelpers.cxx:94:5)>
             ::_M_manager;
  INVALID_NAMED_OBJECT
            (&OStack_58,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
              *)&local_38);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::operator()(__return_storage_ptr__,&OStack_58,errorType,extraFields);
  std::_Function_base::~_Function_base(&OStack_58.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

ErrorGenerator INVALID_OBJECT(ObjectError errorType,
                              const Json::Value::Members& extraFields)
{
  return INVALID_NAMED_OBJECT(
    [](const Json::Value*, cmJSONState*) -> std::string { return "Object"; })(
    errorType, extraFields);
}